

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O1

vector<LongReadMapping,_std::allocator<LongReadMapping>_> * __thiscall
LongReadsMapper::remove_shadowed_matches
          (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__return_storage_ptr__,
          LongReadsMapper *this,vector<LongReadMapping,_std::allocator<LongReadMapping>_> *matches)

{
  iterator __position;
  sgNodeID_t sVar1;
  bool bVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  uint32_t uVar6;
  int32_t iVar7;
  pointer pLVar8;
  pointer pLVar9;
  const_iterator __end2;
  pointer pLVar10;
  LongReadMapping *__args;
  bool bVar11;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__range2;
  ulong uVar12;
  
  (__return_storage_ptr__->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar8 = (matches->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pLVar10 = (matches->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  if (pLVar10 != pLVar8) {
    uVar12 = 0;
    do {
      __args = pLVar8 + uVar12;
      if (pLVar8 == pLVar10) {
LAB_001a722d:
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<LongReadMapping,std::allocator<LongReadMapping>>::
          _M_realloc_insert<LongReadMapping_const&>
                    ((vector<LongReadMapping,std::allocator<LongReadMapping>> *)
                     __return_storage_ptr__,__position,__args);
        }
        else {
          sVar1 = __args->node;
          uVar6 = __args->read_id;
          iVar7 = __args->nStart;
          iVar3 = __args->qStart;
          iVar4 = __args->qEnd;
          iVar5 = __args->score;
          (__position._M_current)->nEnd = __args->nEnd;
          (__position._M_current)->qStart = iVar3;
          (__position._M_current)->qEnd = iVar4;
          (__position._M_current)->score = iVar5;
          (__position._M_current)->node = sVar1;
          (__position._M_current)->read_id = uVar6;
          (__position._M_current)->nStart = iVar7;
          (__return_storage_ptr__->
          super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      else {
        bVar11 = true;
        do {
          pLVar9 = pLVar8 + 1;
          if (((__args->qStart < pLVar8->qStart) || (pLVar8->qEnd < __args->qEnd)) ||
             (pLVar8->score <= __args->score)) {
            bVar2 = false;
          }
          else {
            bVar2 = true;
            bVar11 = false;
          }
        } while ((!bVar2) && (pLVar8 = pLVar9, pLVar9 != pLVar10));
        if (bVar11) goto LAB_001a722d;
      }
      uVar12 = uVar12 + 1;
      pLVar8 = (matches->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pLVar10 = (matches->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    } while (uVar12 < (ulong)((long)pLVar10 - (long)pLVar8 >> 5));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<LongReadMapping> LongReadsMapper::remove_shadowed_matches(const std::vector<LongReadMapping> &matches) const {
    std::vector<LongReadMapping> filtered_matches;

    for (auto mi1=0;mi1<matches.size();++mi1){
        auto &m1=matches[mi1];
        bool use=true;
        for (auto &m2: matches) {
            if (m2.qStart<=m1.qStart and m2.qEnd>=m1.qEnd and m2.score>m1.score){
                use=false;
                break;
            }
        }
        if (use) filtered_matches.emplace_back(m1);
    }

    return filtered_matches;
}